

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCableSegmentType::IfcCableSegmentType(IfcCableSegmentType *this)

{
  IfcCableSegmentType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1e0,"IfcCableSegmentType");
  Schema_2x3::IfcFlowSegmentType::IfcFlowSegmentType
            (&this->super_IfcFlowSegmentType,&PTR_construction_vtable_24__00e95c90);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCableSegmentType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCableSegmentType,_1UL> *)
             &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.field_0x1b0,
             &PTR_construction_vtable_24__00e95e70);
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0xe95b10;
  *(undefined8 *)&this->field_0x1e0 = 0xe95c78;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0xe95b38;
  (this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xe95b60;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0xe95b88;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0xe95bb0;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0xe95bd8;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0xe95c00;
  *(undefined8 *)
   &(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0xe95c28;
  *(undefined8 *)&(this->super_IfcFlowSegmentType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0xe95c50;
  std::__cxx11::string::string((string *)&(this->super_IfcFlowSegmentType).field_0x1c0);
  return;
}

Assistant:

IfcCableSegmentType() : Object("IfcCableSegmentType") {}